

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O0

IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA * prepare_message_diagnostic_data(void)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char *pcVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char *timeBuffer;
  LOGGER_LOG l_1;
  char *diagId;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *result;
  
  l = (LOGGER_LOG)malloc(0x10);
  if (l == (LOGGER_LOG)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x71,1,"malloc for DiagnosticData failed");
    }
  }
  else {
    pcVar2 = (char *)malloc(9);
    if (pcVar2 == (char *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                  ,"prepare_message_diagnostic_data",0x78,1,"malloc for diagId failed");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      generate_eight_random_characters(pcVar2);
      *(char **)l = pcVar2;
      pcVar2 = (char *)malloc(0x1e);
      if (pcVar2 == (char *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                    ,"prepare_message_diagnostic_data",0x86,1,"malloc for timeBuffer failed");
        }
        free(*(void **)l);
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pcVar3 = get_epoch_time(pcVar2);
        if (pcVar3 == (char *)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                      ,"prepare_message_diagnostic_data",0x8d,1,"Failed getting current time");
          }
          free(*(void **)l);
          free(l);
          free(pcVar2);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(char **)(l + 8) = pcVar2;
        }
      }
    }
  }
  return (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)l;
}

Assistant:

static IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* prepare_message_diagnostic_data(void)
{
    IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* result = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA*)malloc(sizeof(IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA));
    if (result == NULL)
    {
        LogError("malloc for DiagnosticData failed");
    }
    else
    {
        char* diagId = (char*)malloc(9);
        if (diagId == NULL)
        {
            LogError("malloc for diagId failed");
            free(result);
            result = NULL;
        }
        else
        {
            char* timeBuffer;

            (void)generate_eight_random_characters(diagId);
            result->diagnosticId = diagId;

            timeBuffer = (char*)malloc(TIME_STRING_BUFFER_LEN);
            if (timeBuffer == NULL)
            {
                LogError("malloc for timeBuffer failed");
                free(result->diagnosticId);
                free(result);
                result = NULL;
            }
            else if (get_epoch_time(timeBuffer) == NULL)
            {
                LogError("Failed getting current time");
                free(result->diagnosticId);
                free(result);
                free(timeBuffer);
                result = NULL;
            }
            else
            {
                result->diagnosticCreationTimeUtc = timeBuffer;
            }
        }
    }
    return result;
}